

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

int __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::erase
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key)

{
  longlong *plVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  self_type **ppsVar9;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_00;
  undefined1 auVar10 [16];
  undefined8 in_XMM0_Qa;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)this->root_node_;
  if ((this_00->super_AlexNode<int,_int>).is_leaf_ == false) {
    iVar6 = *key;
    auVar13._0_8_ = (double)iVar6;
    auVar13._8_8_ = in_XMM0_Qa;
    do {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (this_00->super_AlexNode<int,_int>).model_.a_;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = (this_00->super_AlexNode<int,_int>).model_.b_;
      auVar10 = vfmadd213sd_fma(auVar12,auVar13,auVar10);
      uVar8 = *(int *)&this_00->allocator_ - 1;
      dVar11 = auVar10._0_8_;
      uVar4 = ~((int)dVar11 >> 0x1f) & (int)dVar11;
      if ((int)uVar4 <= (int)uVar8) {
        uVar8 = uVar4;
      }
      this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)(&(this_00->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar8];
    } while ((this_00->super_AlexNode<int,_int>).is_leaf_ != true);
    plVar1 = &(this->stats_).num_node_lookups;
    *plVar1 = *plVar1 + (long)(this_00->super_AlexNode<int,_int>).level_;
    auVar13 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar11 + 0.5)));
    auVar3._8_8_ = 0x7fffffffffffffff;
    auVar3._0_8_ = 0x7fffffffffffffff;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar11 - auVar13._0_8_;
    auVar10 = vandpd_avx512vl(auVar14,auVar3);
    if (auVar10._0_8_ <= dVar11 * 2.220446049250313e-15) {
      if (auVar13._0_8_ <= dVar11) {
        if (this_00->prev_leaf_ ==
            (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)0x0) goto LAB_00138bc1;
        iVar5 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                ::last_key(this_00->prev_leaf_);
        if (iVar5 < iVar6) goto LAB_00138bc1;
        ppsVar9 = &this_00->prev_leaf_;
      }
      else {
        if (this_00->next_leaf_ ==
            (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)0x0) goto LAB_00138bc1;
        iVar5 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                ::first_key(this_00->next_leaf_);
        if (iVar6 < iVar5) goto LAB_00138bc1;
        ppsVar9 = &this_00->next_leaf_;
      }
      this_00 = *ppsVar9;
    }
  }
LAB_00138bc1:
  iVar6 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
          erase(this_00,key);
  (this->stats_).num_keys = (this->stats_).num_keys - iVar6;
  if (this_00->num_keys_ == 0) {
    merge(this,this_00,*key);
  }
  lVar7 = 0xac;
  if (((this->istats_).key_domain_max_ < *key) ||
     (lVar7 = 0xb0, *key < (this->istats_).key_domain_min_)) {
    piVar2 = (int *)((long)&this->root_node_ + lVar7);
    *piVar2 = *piVar2 - iVar6;
  }
  return iVar6;
}

Assistant:

int erase(const T& key) {
    data_node_type* leaf = get_leaf(key);
    int num_erased = leaf->erase(key);
    stats_.num_keys -= num_erased;
    if (leaf->num_keys_ == 0) {
      merge(leaf, key);
    }
    if (key > istats_.key_domain_max_) {
      istats_.num_keys_above_key_domain -= num_erased;
    } else if (key < istats_.key_domain_min_) {
      istats_.num_keys_below_key_domain -= num_erased;
    }
    return num_erased;
  }